

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O3

void __thiscall gimage::GaussKernel::set(GaussKernel *this,float s)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  if (s <= 0.5) {
    s = 0.5;
  }
  uVar4 = (uint)(s * 5.0 + 0.5);
  uVar6 = uVar4 | 1;
  this->kn = uVar6;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)uVar4) {
    uVar3 = (long)(int)uVar6 << 2;
  }
  pfVar1 = (float *)operator_new__(uVar3);
  this->kernel = pfVar1;
  this->kn2 = (int)uVar4 >> 1;
  if ((int)uVar4 < 0) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = 0.0;
    lVar5 = 0;
    do {
      iVar2 = (int)lVar5 - this->kn2;
      fVar7 = expf((float)-(iVar2 * iVar2) / ((s + s) * s));
      pfVar1[lVar5] = fVar7;
      fVar8 = fVar8 + fVar7;
      lVar5 = lVar5 + 1;
      uVar6 = this->kn;
    } while (lVar5 < (int)uVar6);
  }
  if (0 < (int)uVar6) {
    uVar3 = 0;
    do {
      pfVar1[uVar3] = pfVar1[uVar3] / fVar8;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

void set(float s)
    {
      s=std::max(0.5f, s);

      kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      kernel=new float [kn];

      kn2=kn>>1;

      float sum=0;
      for (int i=0; i<kn; i++)
      {
        kernel[i]=static_cast<float>(std::exp(-(i-kn2)*(i-kn2)/(2*s*s)));
        sum+=kernel[i];
      }

      for (int i=0; i<kn; i++)
      {
        kernel[i]/=sum;
      }
    }